

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O2

void http_proxy_io_dowork(CONCRETE_IO_HANDLE http_proxy_io)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (http_proxy_io == (CONCRETE_IO_HANDLE)0x0) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                 ,"http_proxy_io_dowork",0x380,1,"NULL http_proxy_io.");
      return;
    }
  }
  else if (*http_proxy_io != 0) {
    xio_dowork(*(XIO_HANDLE *)((long)http_proxy_io + 0x78));
    return;
  }
  return;
}

Assistant:

static void http_proxy_io_dowork(CONCRETE_IO_HANDLE http_proxy_io)
{
    if (http_proxy_io == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_038: [ If the http_proxy_io argument is NULL, http_proxy_io_dowork shall do nothing. ]*/
        LogError("NULL http_proxy_io.");
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)http_proxy_io;

        if (http_proxy_io_instance->http_proxy_io_state != HTTP_PROXY_IO_STATE_CLOSED)
        {
            /* Codes_SRS_HTTP_PROXY_IO_01_037: [ http_proxy_io_dowork shall call xio_dowork on the underlying IO created in http_proxy_io_create. ]*/
            xio_dowork(http_proxy_io_instance->underlying_io);
        }
    }
}